

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmExtraKateGenerator.cxx
# Opt level: O2

void __thiscall
cmExtraKateGenerator::CreateKateProjectFile(cmExtraKateGenerator *this,cmLocalGenerator *lg)

{
  char *pcVar1;
  ostream *poVar2;
  string filename;
  cmGeneratedFileStream fout;
  string local_2a0;
  char *local_280 [4];
  undefined1 local_260 [584];
  
  pcVar1 = cmLocalGenerator::GetBinaryDirectory(lg);
  std::__cxx11::string::string((string *)local_280,pcVar1,(allocator *)local_260);
  std::__cxx11::string::append((char *)local_280);
  cmGeneratedFileStream::cmGeneratedFileStream
            ((cmGeneratedFileStream *)local_260,local_280[0],false);
  if (((byte)(*(_func_int **)(local_260._0_8_ + -0x18))[(long)(local_260 + 0x20)] & 5) == 0) {
    poVar2 = std::operator<<((ostream *)local_260,"{\n\t\"name\": \"");
    poVar2 = std::operator<<(poVar2,(string *)&this->ProjectName);
    poVar2 = std::operator<<(poVar2,"\",\n\t\"directory\": \"");
    pcVar1 = cmLocalGenerator::GetSourceDirectory(lg);
    poVar2 = std::operator<<(poVar2,pcVar1);
    poVar2 = std::operator<<(poVar2,"\",\n\t\"files\": [ { ");
    GenerateFilesString_abi_cxx11_(&local_2a0,this,lg);
    poVar2 = std::operator<<(poVar2,(string *)&local_2a0);
    std::operator<<(poVar2,"} ],\n");
    std::__cxx11::string::~string((string *)&local_2a0);
    WriteTargets(this,lg,(cmGeneratedFileStream *)local_260);
    std::operator<<((ostream *)local_260,"}\n");
  }
  cmGeneratedFileStream::~cmGeneratedFileStream((cmGeneratedFileStream *)local_260);
  std::__cxx11::string::~string((string *)local_280);
  return;
}

Assistant:

void cmExtraKateGenerator::CreateKateProjectFile(
    const cmLocalGenerator* lg) const
{
  std::string filename = lg->GetBinaryDirectory();
  filename += "/.kateproject";
  cmGeneratedFileStream fout(filename.c_str());
  if (!fout)
    {
    return;
    }

  fout <<
    "{\n"
    "\t\"name\": \"" << this->ProjectName << "\",\n"
    "\t\"directory\": \"" << lg->GetSourceDirectory() << "\",\n"
    "\t\"files\": [ { " << this->GenerateFilesString(lg) << "} ],\n";
  this->WriteTargets(lg, fout);
  fout << "}\n";
}